

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scurve.c
# Opt level: O1

void SCurvePosCtrl_CycleLimited(SCurvePosCtrl_t *pSCurvePosCtrl)

{
  double dVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar5 = pSCurvePosCtrl->Spd;
  fVar3 = pSCurvePosCtrl->Cycle;
  fVar4 = pSCurvePosCtrl->Acc;
  fVar8 = pSCurvePosCtrl->Dec;
  fVar7 = fVar4 + fVar8;
  fVar2 = -fVar4 - fVar8;
  fVar9 = fVar8 * fVar3 - fVar5;
  fVar6 = (fVar4 * fVar9) / fVar7;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 =
       ((fVar4 * fVar3 + fVar5) / fVar7) * (fVar6 + fVar5) * 0.5 +
       ((fVar5 + fVar5 + fVar6) * 0.5 * fVar9) / fVar7;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 =
       ((fVar3 + fVar3) - ABS(fVar5) / fVar4) * fVar5 * 0.5;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 = (fVar5 * 0.5 * ABS(fVar5)) / fVar4;
  fVar8 = -fVar8 * fVar3 - fVar5;
  fVar6 = (fVar4 * fVar8) / fVar2;
  pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 =
       ((fVar5 - fVar4 * fVar3) / fVar2) * (fVar5 - fVar6) * 0.5 +
       (((fVar5 + fVar5) - fVar6) * 0.5 * fVar8) / fVar2;
  do {
    fVar5 = pSCurvePosCtrl->Spd;
    fVar3 = pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0;
    if (fVar5 <= 0.0) {
      fVar4 = pSCurvePosCtrl->DeltaPos;
      if (fVar3 < fVar4) goto LAB_0010b90f;
      if ((fVar4 <= fVar3) && (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 < fVar4))
      goto LAB_0010b937;
      fVar3 = pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1;
      if ((pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 < fVar4) || (fVar4 <= fVar3))
      goto LAB_0010bb58;
      fVar3 = -pSCurvePosCtrl->Acc;
LAB_0010b940:
      pSCurvePosCtrl->Dec = fVar3;
    }
    else {
      fVar4 = pSCurvePosCtrl->DeltaPos;
      if (fVar3 < fVar4) {
LAB_0010b90f:
        fVar3 = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
        goto LAB_0010b919;
      }
      if ((fVar4 <= fVar3) && (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 < fVar4)) {
LAB_0010b937:
        fVar3 = pSCurvePosCtrl->Acc;
LAB_0010b93c:
        fVar3 = ABS(fVar3);
        goto LAB_0010b940;
      }
      fVar3 = pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2;
      if ((fVar4 <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1) && (fVar3 < fVar4)) {
        fVar3 = pSCurvePosCtrl->Acc;
        pSCurvePosCtrl->Acc = -fVar3;
        goto LAB_0010b93c;
      }
LAB_0010bb58:
      if ((fVar4 <= fVar3) && (pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 < fVar4)) {
        fVar3 = -pSCurvePosCtrl->Acc;
LAB_0010b919:
        pSCurvePosCtrl->Acc = fVar3;
        goto LAB_0010b940;
      }
      if (fVar4 <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3) {
        if (0.0 < pSCurvePosCtrl->Acc) {
          fVar3 = -pSCurvePosCtrl->Acc;
          pSCurvePosCtrl->Acc = fVar3;
          pSCurvePosCtrl->Dec = fVar3;
        }
        fVar3 = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
        goto LAB_0010b919;
      }
    }
    fVar3 = pSCurvePosCtrl->Cycle;
    fVar4 = pSCurvePosCtrl->Acc;
    fVar8 = pSCurvePosCtrl->Dec;
    fVar10 = fVar4 / fVar8 + 1.0;
    fVar9 = (fVar5 * -2.0) / fVar8 + fVar3 + fVar3;
    fVar2 = (fVar3 + fVar3) * fVar5;
    fVar7 = fVar5 * -fVar5;
    fVar6 = pSCurvePosCtrl->DeltaPos + pSCurvePosCtrl->DeltaPos;
    fVar8 = fVar6 / fVar4 - (fVar2 * fVar8 + fVar7) / (fVar8 * fVar4);
    if (0.0001 <= ABS(fVar10)) {
      dVar1 = (double)(fVar9 * fVar9 + fVar10 * -4.0 * fVar8);
      if (dVar1 < 0.0) {
        dVar1 = sqrt(dVar1);
      }
      else {
        dVar1 = SQRT(dVar1);
      }
      fVar5 = (float)(((double)fVar9 - dVar1) / (double)(fVar10 + fVar10));
      pSCurvePosCtrl->AccTime = fVar5;
      fVar3 = (pSCurvePosCtrl->Acc * fVar5 + pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Dec;
      pSCurvePosCtrl->DecTime = fVar3;
      pSCurvePosCtrl->MidTime = (pSCurvePosCtrl->Cycle - fVar5) - fVar3;
    }
    else {
      fVar2 = ((fVar6 + fVar7 / fVar4) - fVar2) / (fVar5 + fVar5 + (fVar4 + fVar4) * fVar3);
      pSCurvePosCtrl->AccTime = fVar2;
      fVar5 = -fVar5 / fVar4 - fVar2;
      pSCurvePosCtrl->DecTime = fVar5;
      pSCurvePosCtrl->MidTime = (fVar3 - fVar2) - fVar5;
    }
    if ((((0.0 <= pSCurvePosCtrl->AccTime) && (0.0 <= pSCurvePosCtrl->DecTime)) &&
        (0.0 <= pSCurvePosCtrl->MidTime)) && (0.0 <= fVar9 * fVar9 + fVar10 * -4.0 * fVar8)) {
      return;
    }
  } while( true );
}

Assistant:

static void SCurvePosCtrl_CycleLimited(SCurvePosCtrl_t *pSCurvePosCtrl)
{
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0 = 0.5f * (2.0f * pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec) + 0.5f * (pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * (pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec)) * ((pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc + pSCurvePosCtrl->Dec));
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 = 0.5f * pSCurvePosCtrl->Spd * (2.0f * pSCurvePosCtrl->Cycle - fabs(pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc);
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 = 0.5f * pSCurvePosCtrl->Spd * fabs(pSCurvePosCtrl->Spd) / pSCurvePosCtrl->Acc;
	pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 = 0.5f * (2.0f * pSCurvePosCtrl->Spd - pSCurvePosCtrl->Acc * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec) + 0.5f * (pSCurvePosCtrl->Spd - pSCurvePosCtrl->Acc * (-pSCurvePosCtrl->Dec * pSCurvePosCtrl->Cycle - pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec)) * ((-pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle + pSCurvePosCtrl->Spd) / (-pSCurvePosCtrl->Acc - pSCurvePosCtrl->Dec));

	while (1)
	{
		if (pSCurvePosCtrl->Spd > 0)
		{
			if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3)
			{
				if (pSCurvePosCtrl->Acc > 0)
				{
					pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
					pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
				}
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
		}
		else
		{
			if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc + pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}

			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition0)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = fabs(pSCurvePosCtrl->Acc);
			}

			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition2)
			{
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = -pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos > pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3 && pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition1)
			{
				pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
			else if (pSCurvePosCtrl->DeltaPos <= pSCurvePosCtrl->DeltaPos_CycleLimitedCondition3)
			{
				if (pSCurvePosCtrl->Acc > 0)
				{
					pSCurvePosCtrl->Acc = -pSCurvePosCtrl->Acc;
					pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
				}
				pSCurvePosCtrl->Acc = pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccStep;
				pSCurvePosCtrl->Dec = pSCurvePosCtrl->Acc;
			}
		}

		float coeff_a = 1.0f + pSCurvePosCtrl->Acc / pSCurvePosCtrl->Dec;
		float coeff_b = -(2.0f * pSCurvePosCtrl->Cycle - 2.0f * pSCurvePosCtrl->Spd / pSCurvePosCtrl->Dec);
		float coeff_c = -(2.0f * pSCurvePosCtrl->Cycle * pSCurvePosCtrl->Spd * pSCurvePosCtrl->Dec - pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd) / (pSCurvePosCtrl->Acc * pSCurvePosCtrl->Dec) + 2.0f * pSCurvePosCtrl->DeltaPos / pSCurvePosCtrl->Acc;

		if (fabs(coeff_a) < SCURVE_EQUAL_ERROR)
		{
			pSCurvePosCtrl->AccTime = (2.0f * pSCurvePosCtrl->DeltaPos - pSCurvePosCtrl->Spd * pSCurvePosCtrl->Spd / pSCurvePosCtrl->Acc - 2.0f * pSCurvePosCtrl->Cycle * pSCurvePosCtrl->Spd) / (2.0f * pSCurvePosCtrl->Spd + 2.0f * pSCurvePosCtrl->Acc * pSCurvePosCtrl->Cycle);
			pSCurvePosCtrl->DecTime = -pSCurvePosCtrl->Spd / pSCurvePosCtrl->Acc - pSCurvePosCtrl->AccTime;
			pSCurvePosCtrl->MidTime = pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime - pSCurvePosCtrl->DecTime;
		}
		else
		{
			pSCurvePosCtrl->AccTime = (-coeff_b - sqrt(coeff_b * coeff_b - 4.0f * coeff_a * coeff_c)) / (2.0f * coeff_a);
			pSCurvePosCtrl->DecTime = (pSCurvePosCtrl->Spd + pSCurvePosCtrl->Acc * pSCurvePosCtrl->AccTime) / pSCurvePosCtrl->Dec;
			pSCurvePosCtrl->MidTime = pSCurvePosCtrl->Cycle - pSCurvePosCtrl->AccTime - pSCurvePosCtrl->DecTime;
		}

		if (pSCurvePosCtrl->AccTime >= 0 && pSCurvePosCtrl->DecTime >= 0 && pSCurvePosCtrl->MidTime >= 0 && coeff_b * coeff_b - 4.0f * coeff_a * coeff_c >= 0.0f)
		{
			//printf("acc:%f dec:%f", pSCurvePosCtrl->Acc, pSCurvePosCtrl->Dec);
			break;
		}
		//printf("AccTime:%f DecTime:%f MidTime:%f det:%f acc:%f dec:%f\n", pSCurvePosCtrl->AccTime, pSCurvePosCtrl->DecTime, pSCurvePosCtrl->MidTime, coeff_b * coeff_b - 4.0f * coeff_a * coeff_c, pSCurvePosCtrl->Acc, pSCurvePosCtrl->Dec);
	}
}